

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

void __thiscall BaseSocketImpl::~BaseSocketImpl(BaseSocketImpl *this)

{
  this->_vptr_BaseSocketImpl = (_func_int **)&PTR__BaseSocketImpl_00145338;
  if ((this->m_thListen)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->m_thWrite)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->m_thClose)._M_id._M_thread != 0) {
    std::thread::join();
  }
  std::_Function_base::~_Function_base(&(this->m_fClosingParam).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_fClosing).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_fErrorParam).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_fError).super__Function_base);
  std::thread::~thread(&this->m_thClose);
  std::thread::~thread(&this->m_thWrite);
  std::thread::~thread(&this->m_thListen);
  std::__cxx11::string::~string((string *)&this->m_strName);
  return;
}

Assistant:

BaseSocketImpl::~BaseSocketImpl()
{
    if (m_thListen.joinable() == true)
        m_thListen.join();
    if (m_thWrite.joinable() == true)
        m_thWrite.join();
    if (m_thClose.joinable() == true)
        m_thClose.join();
}